

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_memory_editor.h
# Opt level: O2

void __thiscall
MemoryEditor::CalcSizes(MemoryEditor *this,Sizes *s,size_t mem_size,size_t base_display_addr)

{
  int iVar1;
  ImGuiStyle *pIVar2;
  ulong uVar3;
  int iVar4;
  float fVar5;
  ImVec2 IVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  pIVar2 = ImGui::GetStyle();
  iVar4 = this->OptAddrDigitsCount;
  s->AddrDigitsCount = iVar4;
  if (iVar4 == 0) {
    iVar4 = 1;
    for (uVar3 = (base_display_addr + mem_size) - 1; uVar3 != 0; uVar3 = uVar3 >> 4) {
      s->AddrDigitsCount = iVar4;
      iVar4 = iVar4 + 1;
    }
  }
  fVar5 = ImGui::GetTextLineHeight();
  s->LineHeight = fVar5;
  IVar6 = ImGui::CalcTextSize("F",(char *)0x0,false,-1.0);
  fVar5 = IVar6.x + 1.0;
  s->GlyphWidth = fVar5;
  fVar7 = (float)(int)(fVar5 * 2.5);
  s->HexCellWidth = fVar7;
  s->SpacingBetweenMidCols = (float)(int)(fVar7 * 0.25);
  fVar9 = (float)(s->AddrDigitsCount + 2) * fVar5;
  s->PosHexStart = fVar9;
  iVar4 = this->Cols;
  fVar8 = (float)iVar4;
  fVar9 = fVar7 * fVar8 + fVar9;
  s->PosHexEnd = fVar9;
  s->PosAsciiEnd = fVar9;
  s->PosAsciiStart = fVar9;
  if (this->OptShowAscii == true) {
    fVar9 = fVar9 + fVar5;
    s->PosAsciiStart = fVar9;
    iVar1 = this->OptMidColsCount;
    if (0 < iVar1) {
      fVar9 = fVar9 + (float)((iVar4 + iVar1 + -1) / iVar1) * (float)(int)(fVar7 * 0.25);
      s->PosAsciiStart = fVar9;
    }
    fVar9 = fVar9 + fVar8 * fVar5;
    s->PosAsciiEnd = fVar9;
  }
  fVar7 = (pIVar2->WindowPadding).x;
  s->WindowWidth = fVar5 + fVar7 + fVar7 + fVar9 + pIVar2->ScrollbarSize;
  return;
}

Assistant:

void CalcSizes(Sizes& s, size_t mem_size, size_t base_display_addr)
    {
        ImGuiStyle& style = ImGui::GetStyle();
        s.AddrDigitsCount = OptAddrDigitsCount;
        if (s.AddrDigitsCount == 0)
            for (size_t n = base_display_addr + mem_size - 1; n > 0; n >>= 4)
                s.AddrDigitsCount++;
        s.LineHeight = ImGui::GetTextLineHeight();
        s.GlyphWidth = ImGui::CalcTextSize("F").x + 1;                  // We assume the font is mono-space
        s.HexCellWidth = (float)(int)(s.GlyphWidth * 2.5f);             // "FF " we include trailing space in the width to easily catch clicks everywhere
        s.SpacingBetweenMidCols = (float)(int)(s.HexCellWidth * 0.25f); // Every OptMidColsCount columns we add a bit of extra spacing
        s.PosHexStart = (s.AddrDigitsCount + 2) * s.GlyphWidth;
        s.PosHexEnd = s.PosHexStart + (s.HexCellWidth * Cols);
        s.PosAsciiStart = s.PosAsciiEnd = s.PosHexEnd;
        if (OptShowAscii)
        {
            s.PosAsciiStart = s.PosHexEnd + s.GlyphWidth * 1;
            if (OptMidColsCount > 0)
                s.PosAsciiStart += (float)((Cols + OptMidColsCount - 1) / OptMidColsCount) * s.SpacingBetweenMidCols;
            s.PosAsciiEnd = s.PosAsciiStart + Cols * s.GlyphWidth;
        }
        s.WindowWidth = s.PosAsciiEnd + style.ScrollbarSize + style.WindowPadding.x * 2 + s.GlyphWidth;
    }